

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_edge_iterator.cc
# Opt level: O3

void __thiscall s2shapeutil::EdgeIterator::Next(EdgeIterator *this)

{
  int iVar1;
  long *plVar2;
  int iVar3;
  undefined4 extraout_var;
  
  iVar1 = this->edge_id_ + 1;
  this->edge_id_ = iVar1;
  if (this->num_edges_ <= iVar1) {
    do {
      iVar3 = this->shape_id_ + 1;
      this->shape_id_ = iVar3;
      iVar1 = (*this->index_->_vptr_S2ShapeIndex[2])();
      if (iVar1 <= iVar3) {
        return;
      }
      iVar1 = (*this->index_->_vptr_S2ShapeIndex[3])(this->index_,(ulong)(uint)this->shape_id_);
      plVar2 = (long *)CONCAT44(extraout_var,iVar1);
      if (plVar2 == (long *)0x0) {
        iVar1 = 0;
      }
      else {
        iVar1 = (**(code **)(*plVar2 + 0x10))(plVar2);
      }
      this->num_edges_ = iVar1;
      this->edge_id_ = 0;
    } while (iVar1 < 1);
  }
  return;
}

Assistant:

void EdgeIterator::Next() {
  while (++edge_id_ >= num_edges_) {
    if (++shape_id_ >= index_->num_shape_ids()) break;
    S2Shape* shape = index_->shape(shape_id_);
    num_edges_ = (shape == nullptr) ? 0 : shape->num_edges();
    edge_id_ = -1;
  }
}